

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void llvm::sys::path::remove_filename(SmallVectorImpl<char> *path,Style style)

{
  undefined8 uVar1;
  undefined4 uVar2;
  size_t Size;
  StringRef path_00;
  
  uVar1 = (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar2 = (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  path_00.Length._0_4_ = uVar2;
  path_00.Data = (char *)uVar1;
  path_00.Length._4_4_ = 0;
  Size = anon_unknown.dwarf_a4a5b::parent_path_end(path_00,style);
  if (Size != 0xffffffffffffffff) {
    SmallVectorBase::set_size((SmallVectorBase *)path,Size);
    return;
  }
  return;
}

Assistant:

void remove_filename(SmallVectorImpl<char> &path, Style style) {
  size_t end_pos = parent_path_end(StringRef(path.begin(), path.size()), style);
  if (end_pos != StringRef::npos)
    path.set_size(end_pos);
}